

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_batch_copy_to_file.cpp
# Opt level: O2

void __thiscall
duckdb::FixedBatchCopyGlobalState::AddBatchData
          (FixedBatchCopyGlobalState *this,idx_t batch_index,
          unique_ptr<duckdb::PreparedBatchData,_std::default_delete<duckdb::PreparedBatchData>,_true>
          *new_batch,idx_t memory_usage)

{
  pointer pFVar1;
  InternalException *this_00;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedPreparedBatchData,_std::default_delete<duckdb::FixedPreparedBatchData>,_true>_>_>,_bool>
  pVar2;
  allocator local_59;
  templated_unique_single_t prepared_data;
  string local_50;
  
  ::std::mutex::lock(&this->lock);
  make_uniq<duckdb::FixedPreparedBatchData>();
  pFVar1 = unique_ptr<duckdb::FixedPreparedBatchData,_std::default_delete<duckdb::FixedPreparedBatchData>,_true>
           ::operator->(&prepared_data);
  ::std::__uniq_ptr_impl<duckdb::PreparedBatchData,_std::default_delete<duckdb::PreparedBatchData>_>
  ::operator=((__uniq_ptr_impl<duckdb::PreparedBatchData,_std::default_delete<duckdb::PreparedBatchData>_>
               *)&pFVar1->prepared_data,
              (__uniq_ptr_impl<duckdb::PreparedBatchData,_std::default_delete<duckdb::PreparedBatchData>_>
               *)new_batch);
  pFVar1 = unique_ptr<duckdb::FixedPreparedBatchData,_std::default_delete<duckdb::FixedPreparedBatchData>,_true>
           ::operator->(&prepared_data);
  pFVar1->memory_usage = memory_usage;
  local_50._M_string_length =
       (size_type)
       prepared_data.
       super_unique_ptr<duckdb::FixedPreparedBatchData,_std::default_delete<duckdb::FixedPreparedBatchData>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::FixedPreparedBatchData,_std::default_delete<duckdb::FixedPreparedBatchData>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::FixedPreparedBatchData_*,_std::default_delete<duckdb::FixedPreparedBatchData>_>
       .super__Head_base<0UL,_duckdb::FixedPreparedBatchData_*,_false>._M_head_impl;
  prepared_data.
  super_unique_ptr<duckdb::FixedPreparedBatchData,_std::default_delete<duckdb::FixedPreparedBatchData>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::FixedPreparedBatchData,_std::default_delete<duckdb::FixedPreparedBatchData>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::FixedPreparedBatchData_*,_std::default_delete<duckdb::FixedPreparedBatchData>_>
  .super__Head_base<0UL,_duckdb::FixedPreparedBatchData_*,_false>._M_head_impl =
       (unique_ptr<duckdb::FixedPreparedBatchData,_std::default_delete<duckdb::FixedPreparedBatchData>_>
        )(__uniq_ptr_data<duckdb::FixedPreparedBatchData,_std::default_delete<duckdb::FixedPreparedBatchData>,_true,_true>
          )0x0;
  local_50._M_dataplus._M_p = (pointer)batch_index;
  pVar2 = ::std::
          _Rb_tree<unsigned_long,std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::FixedPreparedBatchData,std::default_delete<duckdb::FixedPreparedBatchData>,true>>,std::_Select1st<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::FixedPreparedBatchData,std::default_delete<duckdb::FixedPreparedBatchData>,true>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::FixedPreparedBatchData,std::default_delete<duckdb::FixedPreparedBatchData>,true>>>>
          ::
          _M_emplace_unique<std::pair<unsigned_long,duckdb::unique_ptr<duckdb::FixedPreparedBatchData,std::default_delete<duckdb::FixedPreparedBatchData>,true>>>
                    ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::FixedPreparedBatchData,std::default_delete<duckdb::FixedPreparedBatchData>,true>>,std::_Select1st<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::FixedPreparedBatchData,std::default_delete<duckdb::FixedPreparedBatchData>,true>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::FixedPreparedBatchData,std::default_delete<duckdb::FixedPreparedBatchData>,true>>>>
                      *)&this->batch_data,
                     (pair<unsigned_long,_duckdb::unique_ptr<duckdb::FixedPreparedBatchData,_std::default_delete<duckdb::FixedPreparedBatchData>,_true>_>
                      *)&local_50);
  ::std::
  unique_ptr<duckdb::FixedPreparedBatchData,_std::default_delete<duckdb::FixedPreparedBatchData>_>::
  ~unique_ptr((unique_ptr<duckdb::FixedPreparedBatchData,_std::default_delete<duckdb::FixedPreparedBatchData>_>
               *)&local_50._M_string_length);
  if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    ::std::
    unique_ptr<duckdb::FixedPreparedBatchData,_std::default_delete<duckdb::FixedPreparedBatchData>_>
    ::~unique_ptr(&prepared_data.
                   super_unique_ptr<duckdb::FixedPreparedBatchData,_std::default_delete<duckdb::FixedPreparedBatchData>_>
                 );
    pthread_mutex_unlock((pthread_mutex_t *)&this->lock);
    return;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_50,"Duplicate batch index %llu encountered in PhysicalFixedBatchCopy",
             &local_59);
  InternalException::InternalException<unsigned_long>(this_00,&local_50,batch_index);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void AddBatchData(idx_t batch_index, unique_ptr<PreparedBatchData> new_batch, idx_t memory_usage) {
		// move the batch data to the set of prepared batch data
		lock_guard<mutex> l(lock);
		auto prepared_data = make_uniq<FixedPreparedBatchData>();
		prepared_data->prepared_data = std::move(new_batch);
		prepared_data->memory_usage = memory_usage;
		auto entry = batch_data.insert(make_pair(batch_index, std::move(prepared_data)));
		if (!entry.second) {
			throw InternalException("Duplicate batch index %llu encountered in PhysicalFixedBatchCopy", batch_index);
		}
	}